

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O3

int rebalance(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  char cVar1;
  vmd_bst_node_t *pvVar2;
  vmd_bst_node_t *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  vmd_bst_node_t *child_3;
  char cVar8;
  uint uVar9;
  vmd_bst_node_t *child_2;
  int iVar10;
  byte bVar11;
  byte bVar12;
  char cVar13;
  vmd_bst_node_t *child;
  vmd_bst_node_t *pvVar14;
  vmd_bst_node_t *child_4;
  
  cVar13 = node->field_0x20 << 5;
  iVar10 = 0;
  if (2 < (byte)((cVar13 >> 5) + 1U)) {
    bVar4 = cVar13 < '\x01';
    pvVar2 = node->child[bVar4];
    cVar1 = pvVar2->field_0x20;
    cVar8 = cVar1 << 5;
    bVar6 = '\0' < cVar8 == '\0' < cVar13;
    pvVar14 = pvVar2;
    if (!bVar6 && cVar8 != '\0') {
      pvVar14 = pvVar2->child['\0' < cVar13];
    }
    pvVar3 = node->parent;
    uVar9 = (byte)node->field_0x20 >> 3 & 1;
    pvVar3->child[uVar9] = pvVar14;
    if (pvVar14 != (vmd_bst_node_t *)0x0) {
      pvVar14->parent = pvVar3;
      pvVar14->field_0x20 = pvVar14->field_0x20 & 0xf7 | (char)uVar9 << 3;
    }
    bVar5 = '\0' < cVar13;
    pvVar3 = pvVar14->child[bVar5];
    node->child[bVar4] = pvVar3;
    if (pvVar3 != (vmd_bst_node_t *)0x0) {
      pvVar3->parent = node;
      pvVar3->field_0x20 = pvVar3->field_0x20 & 0xf7 | (cVar13 < '\x01') << 3;
    }
    pvVar14->child[bVar5] = node;
    node->parent = pvVar14;
    bVar7 = node->field_0x20;
    bVar12 = ('\0' < cVar13) << 3;
    bVar11 = bVar7 & 0xf7 | bVar12;
    node->field_0x20 = bVar11;
    if (bVar6 || cVar8 == '\0') {
      if ((pvVar2->field_0x20 & 7) == 0) {
        if (cVar13 < '\x01') {
          node->field_0x20 = bVar11 | 7;
          pvVar2->field_0x20 = (pvVar2->field_0x20 & 0xf8) + 1;
        }
        else {
          node->field_0x20 = (bVar7 & 0xf0 | bVar12) + 1;
          pvVar2->field_0x20 = pvVar2->field_0x20 | 7;
        }
      }
      else {
        pvVar2->field_0x20 = pvVar2->field_0x20 & 0xf8;
        node->field_0x20 = node->field_0x20 & 0xf8;
      }
    }
    else {
      pvVar3 = pvVar14->child[bVar4];
      pvVar2->child[bVar5] = pvVar3;
      if (pvVar3 != (vmd_bst_node_t *)0x0) {
        pvVar3->parent = pvVar2;
        pvVar3->field_0x20 = pvVar3->field_0x20 & 0xf7 | bVar12;
      }
      pvVar14->child[bVar4] = pvVar2;
      pvVar2->parent = pvVar14;
      pvVar2->field_0x20 = pvVar2->field_0x20 & 0xf7 | (cVar13 < '\x01') << 3;
      if (tree->upd != (vmd_bst_upd_t)0x0) {
        (*tree->upd)(pvVar2);
      }
      node->field_0x20 = node->field_0x20 & 0xf8;
      bVar7 = pvVar2->field_0x20 & 0xf8;
      pvVar2->field_0x20 = bVar7;
      cVar8 = pvVar14->field_0x20 * ' ';
      if (cVar8 != '\0') {
        bVar11 = -pvVar14->field_0x20;
        if ('\0' < cVar13 == cVar8 < ' ') {
          pvVar2->field_0x20 = bVar11 & 7 | bVar7;
        }
        else {
          node->field_0x20 = node->field_0x20 & 0xf8 | bVar11 & 7;
        }
        pvVar14->field_0x20 = pvVar14->field_0x20 & 0xf8;
      }
    }
    iVar10 = (int)((char)(cVar1 << 5) >> 5);
    if (((vmd_bst_t *)node != tree) && (tree->upd != (vmd_bst_upd_t)0x0)) {
      do {
        (*tree->upd)(node);
        node = (((vmd_bst_t *)node)->head).parent;
      } while ((vmd_bst_t *)node != tree);
    }
  }
  return iVar10;
}

Assistant:

static int
rebalance(bst_t *tree, bst_node_t *node)
{
	if (node->balance >= -1 && node->balance <= 1)
		return 0;

	int dir = node->balance > 0;
	bst_node_t *c = node->child[!dir];
	int dbl = c->balance && ((node->balance > 0) != (c->balance > 0));
	bst_node_t *r = dbl ? c->child[dir] : c;

	/* rotation doesn't change the subtree height if c->balance == 0 */
	int ret = c->balance;

	set_child(node->parent, node->idx, r);
	set_child(node, !dir, r->child[dir]);
	set_child(r, dir, node);

	if (dbl) {
		set_child(c, dir, r->child[!dir]);
		set_child(r, !dir, c);

		if (tree->upd)
			tree->upd(c);

		node->balance = 0;
		c->balance = 0;
		if (r->balance) {
			if (dir == (r->balance > 0))
				node->balance = -(r->balance);
			else
				c->balance = -(r->balance);
			r->balance = 0;
		}
	} else {
		if (c->balance)
			node->balance = c->balance = 0;
		else if (dir) {
			node->balance = 1;
			c->balance = -1;
		} else {
			node->balance = -1;
			c->balance = 1;
		}
	}

	update_to_top(tree, node);

	return ret;
}